

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

char * apprun_env_replace_startup_by_original_section
                 (apprun_env_item_t *item,char *startup_value_section)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  char *pcVar4;
  
  pcVar4 = item->original_value;
  sVar1 = strlen(pcVar4);
  __s = item->current_value;
  sVar2 = strlen(__s);
  __s_00 = item->startup_value;
  sVar3 = strlen(__s_00);
  __dest = (char *)calloc((ulong)((((int)sVar2 + (int)sVar1) - (int)sVar3) + 1),1);
  strncpy(__dest,__s,(long)startup_value_section - (long)__s);
  strcat(__dest,pcVar4);
  sVar1 = strlen(__s_00);
  pcVar4 = strcat(__dest,startup_value_section + sVar1);
  return pcVar4;
}

Assistant:

char *apprun_env_replace_startup_by_original_section(const apprun_env_item_t *item,
                                                     const char *startup_value_section) {
    // replace startup_value by original_value
    unsigned new_value_len = strlen(item->original_value) +
                             strlen(item->current_value) - strlen(item->startup_value) + 1;
    char *new_value = calloc(new_value_len, sizeof(char));

    // copy prefixed values
    strncpy(new_value, item->current_value, startup_value_section - item->current_value);

    // add original value
    strcat(new_value, item->original_value);

    // add postfix
    strcat(new_value, startup_value_section + strlen(item->startup_value));
    return new_value;
}